

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O1

void __thiscall wasm::Analyzer::useRefFunc(Analyzer *this,Name func)

{
  char **__k;
  ModuleElement element_00;
  __hashtable *__h;
  Function *pFVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  char *pcVar4;
  __hashtable *__h_1;
  undefined4 uVar5;
  undefined4 uStack_64;
  ModuleElementKind MStack_60;
  undefined4 uStack_5c;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_50;
  __node_gen_type __node_gen;
  ModuleElement element;
  HeapType type;
  Name func_local;
  
  pcVar4 = func.super_IString.str._M_str;
  type.id = func.super_IString.str._M_len;
  if (this->options->closedWorld == false) {
    uVar5 = 0;
    MStack_60 = (ModuleElementKind)func.super_IString.str._M_len;
    uStack_5c = func.super_IString.str._M_len._4_4_;
    __node_gen._M_h._4_4_ = uStack_64;
  }
  else {
    __node_gen._M_h._0_4_ = 0;
    element._0_8_ = type.id;
    element.second.super_IString.str._M_len = (size_t)pcVar4;
    pFVar1 = Module::getFunction(this->module,func);
    element.second.super_IString.str._M_str = (char *)(pFVar1->type).id;
    cVar2 = std::
            _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->calledSignatures)._M_h,
                   (key_type *)&element.second.super_IString.str._M_str);
    __k = &element.second.super_IString.str._M_str;
    if (cVar2.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
      local_50 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->uncalledRefFuncMap,(key_type *)__k);
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                (local_50,&type,&local_50);
      local_50 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->referenced;
      std::
      _Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::pair<wasm::ModuleElementKind,wasm::Name>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::ModuleElementKind,wasm::Name>,true>>>>
                ((_Hashtable<std::pair<wasm::ModuleElementKind,wasm::Name>,std::pair<wasm::ModuleElementKind,wasm::Name>,std::allocator<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::hash<std::pair<wasm::ModuleElementKind,wasm::Name>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_50,&__node_gen,&local_50);
      return;
    }
    cVar3 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->uncalledRefFuncMap)._M_h,(key_type *)__k);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      __assert_fail("uncalledRefFuncMap.count(type) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedModuleElements.cpp"
                    ,0x192,"void wasm::Analyzer::useRefFunc(Name)");
    }
    uVar5 = __node_gen._M_h._0_4_;
    MStack_60 = element.first;
    uStack_5c = element._4_4_;
    pcVar4 = (char *)element.second.super_IString.str._M_len;
  }
  element_00._4_4_ = __node_gen._M_h._4_4_;
  element_00.first = uVar5;
  element_00.second.super_IString.str._M_len._0_4_ = MStack_60;
  element_00.second.super_IString.str._M_len._4_4_ = uStack_5c;
  element_00.second.super_IString.str._M_str = pcVar4;
  use(this,element_00);
  return;
}

Assistant:

void useRefFunc(Name func) {
    if (!options.closedWorld) {
      // The world is open, so assume the worst and something (inside or outside
      // of the module) can call this.
      use({ModuleElementKind::Function, func});
      return;
    }

    // Otherwise, we are in a closed world, and so we can try to optimize the
    // case where the target function is referenced but not used.
    auto element = ModuleElement{ModuleElementKind::Function, func};

    auto type = module->getFunction(func)->type;
    if (calledSignatures.count(type)) {
      // We must not have a type in both calledSignatures and
      // uncalledRefFuncMap: once it is called, we do not track RefFuncs for it
      // any more.
      assert(uncalledRefFuncMap.count(type) == 0);

      // We've seen a RefFunc for this, so it is used.
      use(element);
    } else {
      // We've never seen a CallRef for this, but might see one later.
      uncalledRefFuncMap[type].insert(func);

      referenced.insert(element);
    }
  }